

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

size_t __thiscall cmMakefile::GetRecursionDepthLimit(cmMakefile *this)

{
  _Alloc_hider _Var1;
  bool bVar2;
  cmValue cVar3;
  _Alloc_hider _Var4;
  unsigned_long depthUL;
  unsigned_long depthUL_1;
  undefined1 local_60 [32];
  bool local_40;
  string local_38;
  
  _Var1._M_p = local_60 + 0x10;
  local_60._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"CMAKE_MAXIMUM_RECURSION_DEPTH","");
  cVar3 = GetDefinition(this,(string *)local_60);
  if ((pointer)local_60._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if (cVar3.Value == (string *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"CMAKE_MAXIMUM_RECURSION_DEPTH","");
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    _Var4._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x3e8;
    if (local_40 == true) {
      bVar2 = cmStrToULong((string *)local_60,(unsigned_long *)&local_38);
      _Var4._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x3e8;
      if (bVar2) {
        _Var4._M_p = local_38._M_dataplus._M_p;
      }
    }
    if (((local_40 & 1U) != 0) && (local_40 = false, (pointer)local_60._0_8_ != _Var1._M_p)) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
  }
  else {
    bVar2 = cmStrToULong(((cVar3.Value)->_M_dataplus)._M_p,(unsigned_long *)local_60);
    _Var4._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x3e8;
    if (bVar2) {
      _Var4._M_p = (pointer)local_60._0_8_;
    }
  }
  return (size_t)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var4._M_p;
}

Assistant:

size_t cmMakefile::GetRecursionDepthLimit() const
{
  size_t depth = CMake_DEFAULT_RECURSION_LIMIT;
  if (cmValue depthStr =
        this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH")) {
    unsigned long depthUL;
    if (cmStrToULong(depthStr.GetCStr(), &depthUL)) {
      depth = depthUL;
    }
  } else if (cm::optional<std::string> depthEnv =
               cmSystemTools::GetEnvVar("CMAKE_MAXIMUM_RECURSION_DEPTH")) {
    unsigned long depthUL;
    if (cmStrToULong(*depthEnv, &depthUL)) {
      depth = depthUL;
    }
  }
  return depth;
}